

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnStartFunction
          (BinaryReaderInterp *this,Index func_index)

{
  ModuleDesc *pMVar1;
  iterator __position;
  Result RVar2;
  Enum EVar3;
  Location local_98;
  Var local_70;
  
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,func_index,&local_98);
  RVar2 = SharedValidator::OnStart
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pMVar1 = this->module_;
    local_98.filename.data_ = (char *)CONCAT44(local_98.filename.data_._4_4_,func_index);
    __position._M_current =
         (pMVar1->starts).
         super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pMVar1->starts).
        super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::
      _M_realloc_insert<wabt::interp::StartDesc>(&pMVar1->starts,__position,(StartDesc *)&local_98);
    }
    else {
      (__position._M_current)->func_index = func_index;
      (pMVar1->starts).
      super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnStartFunction(Index func_index) {
  CHECK_RESULT(validator_.OnStart(loc, Var(func_index)));
  module_.starts.push_back(StartDesc{func_index});
  return Result::Ok;
}